

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen12TextureCalc::GetCCSScaleFactor
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,CCS_UNIT *ScaleFactor)

{
  undefined8 uVar1;
  uint32_t uVar2;
  PlatformInfo *pPVar3;
  ulong uVar4;
  uint local_934;
  uint local_930;
  uint32_t CCSModeIdx;
  GMM_TEXTURE_ALIGN_EX TexAlignEx;
  GMM_STATUS Status;
  CCS_UNIT *ScaleFactor_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen12TextureCalc *this_local;
  
  TexAlignEx.CCSEx[0x5f].Downscale.Height = 0;
  unique0x100002eb = ScaleFactor;
  pPVar3 = Context::GetPlatformInfoObj
                     ((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                      super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext);
  (*pPVar3->_vptr_PlatformInfo[9])(&stack0xfffffffffffff6d4);
  if (((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) &&
      (((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0)) &&
     (((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) == 0)) {
    local_930 = pTexInfo->CCSModeAlign;
  }
  else {
    if ((int)pTexInfo->TileMode < 0xd) {
      local_934 = 0x60;
    }
    else {
      local_934 = pTexInfo->TileMode - TILE_YF_2D_8bpe;
    }
    local_930 = local_934;
  }
  if (local_930 < 0x60) {
    uVar4 = (ulong)local_930;
    uVar2 = TexAlignEx.CCSEx[uVar4 - 1].Downscale.Depth;
    (unique0x1000029b->Align).Width = TexAlignEx.CCSEx[uVar4 - 1].Downscale.Height;
    (unique0x1000029b->Align).Height = uVar2;
    *(undefined8 *)&(stack0xffffffffffffffd8->Align).Depth =
         *(undefined8 *)&TexAlignEx.CCSEx[uVar4].Align;
    uVar1 = *(undefined8 *)&TexAlignEx.CCSEx[uVar4].Align.Depth;
    (unique0x1000029b->Downscale).Height = (int)uVar1;
    (unique0x1000029b->Downscale).Depth = (int)((ulong)uVar1 >> 0x20);
    this_local._4_4_ = TexAlignEx.CCSEx[0x5f].Downscale.Height;
  }
  else {
    this_local._4_4_ = GMM_ERROR;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen12TextureCalc::GetCCSScaleFactor(GMM_TEXTURE_INFO *pTexInfo,
                                                                      CCS_UNIT &        ScaleFactor)
{
    GMM_STATUS           Status     = GMM_SUCCESS;
    GMM_TEXTURE_ALIGN_EX TexAlignEx = static_cast<PlatformInfoGen12 *>(pGmmLibContext->GetPlatformInfoObj())->GetExTextureAlign();
    uint32_t             CCSModeIdx = 0;

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) //pTexInfo is RT Surf
    {
        CCSModeIdx = CCS_MODE(pTexInfo->TileMode);
        __GMM_ASSERT(pTexInfo->TileMode < GMM_TILE_MODES);
    }
    else //pTexInfo is CCS Surf
    {
        CCSModeIdx = pTexInfo->CCSModeAlign;
    }

    if(!(CCSModeIdx < CCS_MODES))
    {
        __GMM_ASSERT(0); //indicates something wrong w/ H/V/D Align Filling function or Wrong TileMode set
        return GMM_ERROR;
    }

    ScaleFactor = TexAlignEx.CCSEx[CCSModeIdx];

    return (Status);
}